

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_cross.cpp
# Opt level: O0

void __thiscall
spirv_cross::Compiler::set_extended_member_decoration
          (Compiler *this,uint32_t type,uint32_t index,ExtendedDecorations decoration,uint32_t value
          )

{
  mapped_type *pmVar1;
  mapped_type *pmVar2;
  unsigned_long *puVar3;
  TypedID<(spirv_cross::Types)0> local_4c;
  Decoration *local_48;
  Decoration *dec;
  TypedID<(spirv_cross::Types)0> local_34;
  size_t local_30;
  TypedID<(spirv_cross::Types)0> local_24;
  uint32_t local_20;
  ExtendedDecorations local_1c;
  uint32_t value_local;
  ExtendedDecorations decoration_local;
  uint32_t index_local;
  uint32_t type_local;
  Compiler *this_local;
  
  local_20 = value;
  local_1c = decoration;
  value_local = index;
  decoration_local = type;
  _index_local = this;
  TypedID<(spirv_cross::Types)0>::TypedID(&local_24,type);
  pmVar1 = ::std::
           unordered_map<spirv_cross::TypedID<(spirv_cross::Types)0>,_spirv_cross::Meta,_std::hash<spirv_cross::TypedID<(spirv_cross::Types)0>_>,_std::equal_to<spirv_cross::TypedID<(spirv_cross::Types)0>_>,_std::allocator<std::pair<const_spirv_cross::TypedID<(spirv_cross::Types)0>,_spirv_cross::Meta>_>_>
           ::operator[](&(this->ir).meta,&local_24);
  TypedID<(spirv_cross::Types)0>::TypedID(&local_34,decoration_local);
  pmVar2 = ::std::
           unordered_map<spirv_cross::TypedID<(spirv_cross::Types)0>,_spirv_cross::Meta,_std::hash<spirv_cross::TypedID<(spirv_cross::Types)0>_>,_std::equal_to<spirv_cross::TypedID<(spirv_cross::Types)0>_>,_std::allocator<std::pair<const_spirv_cross::TypedID<(spirv_cross::Types)0>,_spirv_cross::Meta>_>_>
           ::operator[](&(this->ir).meta,&local_34);
  local_30 = VectorView<spirv_cross::Meta::Decoration>::size
                       (&(pmVar2->members).super_VectorView<spirv_cross::Meta::Decoration>);
  dec = (Decoration *)((ulong)value_local + 1);
  puVar3 = ::std::max<unsigned_long>(&local_30,(unsigned_long *)&dec);
  SmallVector<spirv_cross::Meta::Decoration,_0UL>::resize(&pmVar1->members,*puVar3);
  TypedID<(spirv_cross::Types)0>::TypedID(&local_4c,decoration_local);
  pmVar1 = ::std::
           unordered_map<spirv_cross::TypedID<(spirv_cross::Types)0>,_spirv_cross::Meta,_std::hash<spirv_cross::TypedID<(spirv_cross::Types)0>_>,_std::equal_to<spirv_cross::TypedID<(spirv_cross::Types)0>_>,_std::allocator<std::pair<const_spirv_cross::TypedID<(spirv_cross::Types)0>,_spirv_cross::Meta>_>_>
           ::operator[](&(this->ir).meta,&local_4c);
  local_48 = VectorView<spirv_cross::Meta::Decoration>::operator[]
                       (&(pmVar1->members).super_VectorView<spirv_cross::Meta::Decoration>,
                        (ulong)value_local);
  Bitset::set(&(local_48->extended).flags,local_1c);
  (local_48->extended).values[local_1c] = local_20;
  return;
}

Assistant:

void Compiler::set_extended_member_decoration(uint32_t type, uint32_t index, ExtendedDecorations decoration,
                                              uint32_t value)
{
	ir.meta[type].members.resize(max(ir.meta[type].members.size(), size_t(index) + 1));
	auto &dec = ir.meta[type].members[index];
	dec.extended.flags.set(decoration);
	dec.extended.values[decoration] = value;
}